

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcTankType::IfcTankType(IfcTankType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcTankType";
  Schema_2x3::IfcFlowStorageDeviceType::IfcFlowStorageDeviceType
            (&this->super_IfcFlowStorageDeviceType,&PTR_construction_vtable_24__008b96e8);
  *(undefined8 *)&(this->super_IfcFlowStorageDeviceType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x8b9568;
  *(undefined8 *)&this->field_0x1e0 = 0x8b96d0;
  *(undefined8 *)
   &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x8b9590;
  (this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x8b95b8;
  *(undefined8 *)
   &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x8b95e0;
  *(undefined8 *)
   &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x8b9608;
  *(undefined8 *)
   &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x8b9630;
  *(undefined8 *)
   &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x8b9658;
  *(undefined8 *)
   &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x8b9680;
  *(undefined8 *)
   &(this->super_IfcFlowStorageDeviceType).super_IfcDistributionFlowElementType.field_0x1b0 =
       0x8b96a8;
  *(undefined1 **)&(this->super_IfcFlowStorageDeviceType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcTankType() : Object("IfcTankType") {}